

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::startClientEncryption(QSslSocket *this)

{
  bool bVar1;
  SocketState SVar2;
  QSslSocketPrivate *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff28;
  SslMode in_stack_ffffffffffffff2c;
  QSslSocketPrivate *in_stack_ffffffffffffff30;
  QSslSocketPrivate *this_01;
  char local_98 [32];
  char local_78 [32];
  char local_58 [32];
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSslSocket *)0x3a2d90);
  if (this_00->mode == UnencryptedMode) {
    SVar2 = QAbstractSocket::state((QAbstractSocket *)0x3a2e42);
    if (SVar2 == ConnectedState) {
      bVar1 = supportsSsl();
      if (bVar1) {
        bVar1 = QSslSocketPrivate::verifyProtocolSupported(this_00,in_RDI);
        if (bVar1) {
          this_00->mode = SslClientMode;
          modeChanged((QSslSocket *)0x3a2fe8,in_stack_ffffffffffffff2c);
          QSslSocketPrivate::startClientEncryption(in_stack_ffffffffffffff30);
        }
      }
      else {
        local_38 = 0xaaaaaaaaaaaaaaaa;
        local_30 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcSsl();
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff30,
                   (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
          anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a2f36);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_00,in_RDI,
                     (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (char *)0x3a2f4c);
          QMessageLogger::warning
                    (local_98,"QSslSocket::startClientEncryption: TLS initialization failed");
          local_30 = local_30 & 0xffffffffffffff00;
        }
        this_01 = this_00;
        tr(in_RDI,(char *)this_00,in_stack_ffffffffffffff2c);
        QAbstractSocketPrivate::setErrorAndEmit
                  ((QAbstractSocketPrivate *)this_01,(SocketError)((ulong)in_RDI >> 0x20),
                   (QString *)this_00);
        QString::~QString((QString *)0x3a2fab);
      }
    }
    else {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff30,
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a2e9e);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (char *)0x3a2eb4);
        QMessageLogger::warning
                  (local_78,
                   "QSslSocket::startClientEncryption: cannot start handshake when not connected");
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff30,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a2dfa);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (char *)0x3a2e13);
      QMessageLogger::warning
                (local_58,
                 "QSslSocket::startClientEncryption: cannot start handshake on non-plain connection"
                );
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::startClientEncryption()
{
    Q_D(QSslSocket);
    if (d->mode != UnencryptedMode) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake on non-plain connection");
        return;
    }
    if (state() != ConnectedState) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake when not connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::startClientEncryption: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    if (!d->verifyProtocolSupported("QSslSocket::startClientEncryption:"))
        return;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::startClientEncryption()";
#endif
    d->mode = SslClientMode;
    emit modeChanged(d->mode);
    d->startClientEncryption();
}